

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_getopt_long.c
# Opt level: O3

void permute_args(int panonopt_start,int panonopt_end,int opt_end,char **nargv)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  char *pcVar11;
  
  uVar10 = opt_end - panonopt_end;
  uVar3 = (long)(panonopt_end - panonopt_start) % (long)(int)uVar10;
  uVar9 = uVar3 & 0xffffffff;
  uVar6 = (uint)uVar3;
  uVar4 = uVar10;
  while (uVar6 != 0) {
    uVar5 = (uint)uVar9;
    uVar6 = (int)uVar4 % (int)uVar5;
    uVar9 = (ulong)uVar6;
    uVar4 = uVar5;
  }
  uVar3 = (long)(opt_end - panonopt_start) / (long)(int)uVar4;
  if (0 < (int)uVar4) {
    uVar9 = 0;
    do {
      if (0 < (int)uVar3) {
        uVar1 = uVar9 + (long)panonopt_end;
        uVar7 = uVar3 & 0xffffffff;
        uVar8 = uVar1 & 0xffffffff;
        pcVar11 = nargv[uVar1];
        do {
          uVar6 = uVar10;
          if (panonopt_end <= (int)uVar8) {
            uVar6 = -(panonopt_end - panonopt_start);
          }
          uVar6 = (int)uVar8 + uVar6;
          uVar8 = (ulong)uVar6;
          pcVar2 = nargv[(int)uVar6];
          nargv[(int)uVar6] = pcVar11;
          nargv[uVar1] = pcVar2;
          uVar6 = (int)uVar7 - 1;
          uVar7 = (ulong)uVar6;
          pcVar11 = pcVar2;
        } while (uVar6 != 0);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar4);
  }
  return;
}

Assistant:

static void
permute_args(int panonopt_start, int panonopt_end, int opt_end,
	char * const *nargv)
{
	int cstart, cyclelen, i, j, ncycle, nnonopts, nopts, pos;
	char *swap;

	/*
	 * compute lengths of blocks and number and size of cycles
	 */
	nnonopts = panonopt_end - panonopt_start;
	nopts = opt_end - panonopt_end;
	ncycle = gcd(nnonopts, nopts);
	cyclelen = (opt_end - panonopt_start) / ncycle;

	for (i = 0; i < ncycle; i++) {
		cstart = panonopt_end+i;
		pos = cstart;
		for (j = 0; j < cyclelen; j++) {
			if (pos >= panonopt_end)
				pos -= nnonopts;
			else
				pos += nopts;
			swap = nargv[pos];
			/* LINTED const cast */
			((char **) nargv)[pos] = nargv[cstart];
			/* LINTED const cast */
			((char **)nargv)[cstart] = swap;
		}
	}
}